

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O2

XrResult ValidateXrStruct(GenValidUsageXrInstanceInfo *instance_info,string *command_name,
                         vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                         *objects_info,bool check_members,bool check_pnext,
                         XrFaceExpressionWeights2FB *value)

{
  bool bVar1;
  NextChainResult NVar2;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *this;
  XrResult XVar3;
  uint32_t in_stack_fffffffffffffcfc;
  allocator local_2f9;
  string *local_2f8;
  string local_2f0;
  allocator local_2c9;
  string local_2c8;
  vector<XrStructureType,_std::allocator<XrStructureType>_> valid_ext_structs;
  vector<XrStructureType,_std::allocator<XrStructureType>_> duplicate_ext_structs;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_270;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_258;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_240;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_228;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_210;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_1f8;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_1e0;
  vector<XrStructureType,_std::allocator<XrStructureType>_> encountered_structs;
  string error_message;
  
  XVar3 = XR_SUCCESS;
  local_2f8 = command_name;
  if (value->type != XR_TYPE_FACE_EXPRESSION_WEIGHTS2_FB) {
    XVar3 = XR_ERROR_VALIDATION_FAILURE;
    InvalidStructureType
              (instance_info,command_name,objects_info,"XrFaceExpressionWeights2FB",value->type,
               "VUID-XrFaceExpressionWeights2FB-type-type",XR_TYPE_FACE_EXPRESSION_WEIGHTS2_FB,
               "XR_TYPE_FACE_EXPRESSION_WEIGHTS2_FB");
  }
  if (!check_pnext) goto LAB_0019cd43;
  valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  duplicate_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  duplicate_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  duplicate_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  encountered_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  encountered_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  encountered_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  NVar2 = ValidateNextChain(instance_info,local_2f8,objects_info,value->next,&valid_ext_structs,
                            &encountered_structs,&duplicate_ext_structs);
  if (NVar2 == NEXT_CHAIN_RESULT_DUPLICATE_STRUCT) {
    std::__cxx11::string::string
              ((string *)&error_message,
               "Multiple structures of the same type(s) in \"next\" chain for ",
               (allocator *)&local_2f0);
    std::__cxx11::string::append((char *)&error_message);
    StructTypesToString_abi_cxx11_(&local_2f0,instance_info,&duplicate_ext_structs);
    std::__cxx11::string::append((string *)&error_message);
    std::__cxx11::string::~string((string *)&local_2f0);
    std::__cxx11::string::string
              ((string *)&local_2f0,"VUID-XrFaceExpressionWeights2FB-next-unique",&local_2f9);
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
              ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
               &local_1f8,objects_info);
    std::__cxx11::string::string
              ((string *)&local_2c8,
               "Multiple structures of the same type(s) in \"next\" chain for XrFaceExpressionWeights2FB struct"
               ,&local_2c9);
    CoreValidLogMessage(instance_info,&local_2f0,VALID_USAGE_DEBUG_SEVERITY_ERROR,local_2f8,
                        (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                         *)&local_1f8,&local_2c8);
    std::__cxx11::string::~string((string *)&local_2c8);
    std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
    ~_Vector_base(&local_1f8);
    std::__cxx11::string::~string((string *)&local_2f0);
LAB_0019cd0e:
    std::__cxx11::string::~string((string *)&error_message);
    XVar3 = XR_ERROR_VALIDATION_FAILURE;
  }
  else if (NVar2 == NEXT_CHAIN_RESULT_ERROR) {
    std::__cxx11::string::string
              ((string *)&error_message,"VUID-XrFaceExpressionWeights2FB-next-next",
               (allocator *)&local_2c8);
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
              ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
               &local_1e0,objects_info);
    std::__cxx11::string::string
              ((string *)&local_2f0,
               "Invalid structure(s) in \"next\" chain for XrFaceExpressionWeights2FB struct \"next\""
               ,&local_2f9);
    CoreValidLogMessage(instance_info,&error_message,VALID_USAGE_DEBUG_SEVERITY_ERROR,local_2f8,
                        (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                         *)&local_1e0,&local_2f0);
    std::__cxx11::string::~string((string *)&local_2f0);
    std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
    ~_Vector_base(&local_1e0);
    goto LAB_0019cd0e;
  }
  std::_Vector_base<XrStructureType,_std::allocator<XrStructureType>_>::~_Vector_base
            (&encountered_structs.
              super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>);
  std::_Vector_base<XrStructureType,_std::allocator<XrStructureType>_>::~_Vector_base
            (&duplicate_ext_structs.
              super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>);
  std::_Vector_base<XrStructureType,_std::allocator<XrStructureType>_>::~_Vector_base
            (&valid_ext_structs.
              super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>);
LAB_0019cd43:
  if (!check_members || XVar3 != XR_SUCCESS) {
    return XVar3;
  }
  XVar3 = XR_SUCCESS;
  if ((value->weightCount == 0) && (value->weights != (float *)0x0)) {
    std::__cxx11::string::string
              ((string *)&error_message,"VUID-XrFaceExpressionWeights2FB-weightCount-arraylength",
               (allocator *)&local_2c8);
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
              ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
               &local_210,objects_info);
    std::__cxx11::string::string
              ((string *)&local_2f0,
               "Structure XrFaceExpressionWeights2FB member weightCount is non-optional and must be greater than 0"
               ,(allocator *)&valid_ext_structs);
    CoreValidLogMessage(instance_info,&error_message,VALID_USAGE_DEBUG_SEVERITY_ERROR,local_2f8,
                        (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                         *)&local_210,&local_2f0);
    std::__cxx11::string::~string((string *)&local_2f0);
    std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
    ~_Vector_base(&local_210);
    std::__cxx11::string::~string((string *)&error_message);
    XVar3 = XR_ERROR_VALIDATION_FAILURE;
  }
  if ((value->weights == (float *)0x0) && (value->weightCount != 0)) {
    std::__cxx11::string::string
              ((string *)&error_message,"VUID-XrFaceExpressionWeights2FB-weights-parameter",
               (allocator *)&local_2c8);
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
              ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
               &local_228,objects_info);
    std::__cxx11::string::string
              ((string *)&local_2f0,
               "XrFaceExpressionWeights2FB contains invalid NULL for float \"weights\" is which not optional since \"weightCount\" is set and must be non-NULL"
               ,(allocator *)&valid_ext_structs);
    CoreValidLogMessage(instance_info,&error_message,VALID_USAGE_DEBUG_SEVERITY_ERROR,local_2f8,
                        (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                         *)&local_228,&local_2f0);
    std::__cxx11::string::~string((string *)&local_2f0);
    this = &local_228;
  }
  else {
    if ((value->confidenceCount == 0) && (value->confidences != (float *)0x0)) {
      std::__cxx11::string::string
                ((string *)&error_message,
                 "VUID-XrFaceExpressionWeights2FB-confidenceCount-arraylength",
                 (allocator *)&local_2c8);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                 &local_240,objects_info);
      std::__cxx11::string::string
                ((string *)&local_2f0,
                 "Structure XrFaceExpressionWeights2FB member confidenceCount is non-optional and must be greater than 0"
                 ,(allocator *)&valid_ext_structs);
      CoreValidLogMessage(instance_info,&error_message,VALID_USAGE_DEBUG_SEVERITY_ERROR,local_2f8,
                          (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                           *)&local_240,&local_2f0);
      std::__cxx11::string::~string((string *)&local_2f0);
      std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
      ~_Vector_base(&local_240);
      std::__cxx11::string::~string((string *)&error_message);
      XVar3 = XR_ERROR_VALIDATION_FAILURE;
    }
    if ((value->confidences != (float *)0x0) || (value->confidenceCount == 0)) {
      std::__cxx11::string::string
                ((string *)&error_message,"XrFaceExpressionWeights2FB",(allocator *)&local_2c8);
      std::__cxx11::string::string
                ((string *)&local_2f0,"dataSource",(allocator *)&valid_ext_structs);
      bVar1 = ValidateXrEnum(instance_info,local_2f8,&error_message,&local_2f0,objects_info,
                             value->dataSource);
      std::__cxx11::string::~string((string *)&local_2f0);
      std::__cxx11::string::~string((string *)&error_message);
      if (!bVar1) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message);
        std::operator<<((ostream *)&error_message,
                        "XrFaceExpressionWeights2FB contains invalid XrFaceTrackingDataSource2FB \"dataSource\" enum value "
                       );
        Uint32ToHexString_abi_cxx11_(in_stack_fffffffffffffcfc);
        std::operator<<((ostream *)&error_message,(string *)&local_2f0);
        std::__cxx11::string::~string((string *)&local_2f0);
        std::__cxx11::string::string
                  ((string *)&local_2f0,"VUID-XrFaceExpressionWeights2FB-dataSource-parameter",
                   (allocator *)&valid_ext_structs);
        std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                  ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                   &local_270,objects_info);
        std::__cxx11::stringbuf::str();
        CoreValidLogMessage(instance_info,&local_2f0,VALID_USAGE_DEBUG_SEVERITY_ERROR,local_2f8,
                            (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                             *)&local_270,&local_2c8);
        std::__cxx11::string::~string((string *)&local_2c8);
        std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
        ~_Vector_base(&local_270);
        std::__cxx11::string::~string((string *)&local_2f0);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&error_message);
        return XR_ERROR_VALIDATION_FAILURE;
      }
      return XVar3;
    }
    std::__cxx11::string::string
              ((string *)&error_message,"VUID-XrFaceExpressionWeights2FB-confidences-parameter",
               (allocator *)&local_2c8);
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
              ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
               &local_258,objects_info);
    std::__cxx11::string::string
              ((string *)&local_2f0,
               "XrFaceExpressionWeights2FB contains invalid NULL for float \"confidences\" is which not optional since \"confidenceCount\" is set and must be non-NULL"
               ,(allocator *)&valid_ext_structs);
    CoreValidLogMessage(instance_info,&error_message,VALID_USAGE_DEBUG_SEVERITY_ERROR,local_2f8,
                        (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                         *)&local_258,&local_2f0);
    std::__cxx11::string::~string((string *)&local_2f0);
    this = &local_258;
  }
  std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
  ~_Vector_base(this);
  std::__cxx11::string::~string((string *)&error_message);
  return XR_ERROR_VALIDATION_FAILURE;
}

Assistant:

XrResult ValidateXrStruct(GenValidUsageXrInstanceInfo *instance_info, const std::string &command_name,
                          std::vector<GenValidUsageXrObjectInfo>& objects_info, bool check_members, bool check_pnext,
                          const XrFaceExpressionWeights2FB* value) {
    XrResult xr_result = XR_SUCCESS;
    (void)xr_result;
    (void)instance_info;
    (void)command_name;
    (void)objects_info;
    (void)check_members;
    (void)value;
    // Make sure the structure type is correct
    if (value->type != XR_TYPE_FACE_EXPRESSION_WEIGHTS2_FB) {
        InvalidStructureType(instance_info, command_name, objects_info, "XrFaceExpressionWeights2FB",
                             value->type, "VUID-XrFaceExpressionWeights2FB-type-type", XR_TYPE_FACE_EXPRESSION_WEIGHTS2_FB, "XR_TYPE_FACE_EXPRESSION_WEIGHTS2_FB");
        xr_result = XR_ERROR_VALIDATION_FAILURE;
    }
    if (check_pnext) {
        std::vector<XrStructureType> valid_ext_structs;
        std::vector<XrStructureType> duplicate_ext_structs;
        std::vector<XrStructureType> encountered_structs;
        NextChainResult next_result = ValidateNextChain(instance_info, command_name, objects_info,
                                                         value->next, valid_ext_structs,
                                                         encountered_structs,
                                                         duplicate_ext_structs);
        // No valid extension structs for this 'next'.  Therefore, must be NULL
        // or only contain a list of valid extension structures.
        if (NEXT_CHAIN_RESULT_ERROR == next_result) {
            CoreValidLogMessage(instance_info, "VUID-XrFaceExpressionWeights2FB-next-next",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                objects_info, "Invalid structure(s) in \"next\" chain for XrFaceExpressionWeights2FB struct \"next\"");
            xr_result = XR_ERROR_VALIDATION_FAILURE;
        } else if (NEXT_CHAIN_RESULT_DUPLICATE_STRUCT == next_result) {
            std::string error_message = "Multiple structures of the same type(s) in \"next\" chain for ";
            error_message += "XrFaceExpressionWeights2FB : ";
            error_message += StructTypesToString(instance_info, duplicate_ext_structs);
            CoreValidLogMessage(instance_info, "VUID-XrFaceExpressionWeights2FB-next-unique",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                objects_info,
            "Multiple structures of the same type(s) in \"next\" chain for XrFaceExpressionWeights2FB struct");
            xr_result = XR_ERROR_VALIDATION_FAILURE;
        }
    }
    // If we are not to check the rest of the members, just return here.
    if (!check_members || XR_SUCCESS != xr_result) {
        return xr_result;
    }
    // Non-optional array length must be non-zero
    if (0 >= value->weightCount && nullptr != value->weights) {
        CoreValidLogMessage(instance_info, "VUID-XrFaceExpressionWeights2FB-weightCount-arraylength",
                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                            objects_info,
                            "Structure XrFaceExpressionWeights2FB member weightCount is non-optional and must be greater than 0");
        xr_result = XR_ERROR_VALIDATION_FAILURE;
    }
    // Pointer/array variable with a length variable.  Make sure that
    // if length variable is non-zero that the pointer is not NULL
    if (nullptr == value->weights && 0 != value->weightCount) {
        CoreValidLogMessage(instance_info, "VUID-XrFaceExpressionWeights2FB-weights-parameter",
                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name, objects_info,
                            "XrFaceExpressionWeights2FB contains invalid NULL for float \"weights\" is which not "
                            "optional since \"weightCount\" is set and must be non-NULL");
        return XR_ERROR_VALIDATION_FAILURE;
    }
    // NOTE: Can't validate "VUID-XrFaceExpressionWeights2FB-weights-parameter" type
    // Non-optional array length must be non-zero
    if (0 >= value->confidenceCount && nullptr != value->confidences) {
        CoreValidLogMessage(instance_info, "VUID-XrFaceExpressionWeights2FB-confidenceCount-arraylength",
                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                            objects_info,
                            "Structure XrFaceExpressionWeights2FB member confidenceCount is non-optional and must be greater than 0");
        xr_result = XR_ERROR_VALIDATION_FAILURE;
    }
    // Pointer/array variable with a length variable.  Make sure that
    // if length variable is non-zero that the pointer is not NULL
    if (nullptr == value->confidences && 0 != value->confidenceCount) {
        CoreValidLogMessage(instance_info, "VUID-XrFaceExpressionWeights2FB-confidences-parameter",
                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name, objects_info,
                            "XrFaceExpressionWeights2FB contains invalid NULL for float \"confidences\" is which not "
                            "optional since \"confidenceCount\" is set and must be non-NULL");
        return XR_ERROR_VALIDATION_FAILURE;
    }
    // NOTE: Can't validate "VUID-XrFaceExpressionWeights2FB-confidences-parameter" type
    // Make sure the enum type XrFaceTrackingDataSource2FB value is valid
    if (!ValidateXrEnum(instance_info, command_name, "XrFaceExpressionWeights2FB", "dataSource", objects_info, value->dataSource)) {
        std::ostringstream oss_enum;
        oss_enum << "XrFaceExpressionWeights2FB contains invalid XrFaceTrackingDataSource2FB \"dataSource\" enum value ";
        oss_enum << Uint32ToHexString(static_cast<uint32_t>(value->dataSource));
        CoreValidLogMessage(instance_info, "VUID-XrFaceExpressionWeights2FB-dataSource-parameter",
                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                            objects_info, oss_enum.str());
        return XR_ERROR_VALIDATION_FAILURE;
    }
    // Everything checked out properly
    return xr_result;
}